

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_privkey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  bool bVar1;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_scalar factor;
  int local_5c;
  secp256k1_scalar local_58;
  secp256k1_scalar local_38;
  
  local_5c = 0;
  secp256k1_scalar_set_b32(&local_38,tweak,&local_5c);
  bVar1 = false;
  secp256k1_scalar_set_b32(&local_58,seckey,(int *)0x0);
  if ((local_5c == 0) &&
     (bVar1 = (local_38.d[3] != 0 || local_38.d[1] != 0) ||
              (local_38.d[2] != 0 || local_38.d[0] != 0),
     (local_38.d[3] != 0 || local_38.d[1] != 0) || (local_38.d[2] != 0 || local_38.d[0] != 0))) {
    secp256k1_scalar_mul(&local_58,&local_58,&local_38);
  }
  *(undefined1 (*) [16])(seckey + 0x10) = (undefined1  [16])0x0;
  seckey[0] = '\0';
  seckey[1] = '\0';
  seckey[2] = '\0';
  seckey[3] = '\0';
  seckey[4] = '\0';
  seckey[5] = '\0';
  seckey[6] = '\0';
  seckey[7] = '\0';
  seckey[8] = '\0';
  seckey[9] = '\0';
  seckey[10] = '\0';
  seckey[0xb] = '\0';
  seckey[0xc] = '\0';
  seckey[0xd] = '\0';
  seckey[0xe] = '\0';
  seckey[0xf] = '\0';
  if (bVar1 != false) {
    secp256k1_scalar_get_b32(seckey,&local_58);
  }
  return (int)bVar1;
}

Assistant:

int secp256k1_ec_privkey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&factor, tweak, &overflow);
    secp256k1_scalar_set_b32(&sec, seckey, NULL);
    ret = !overflow && secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    memset(seckey, 0, 32);
    if (ret) {
        secp256k1_scalar_get_b32(seckey, &sec);
    }

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}